

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerWriteLargeSector(PgHdr *pPg)

{
  int iVar1;
  DbPage *pPg_00;
  PgHdr *pPage_1;
  PgHdr *pPage;
  Pgno pg;
  Pgno nPagePerSector;
  Pager *pPager;
  int needSync;
  int ii;
  int nPage;
  Pgno pg1;
  Pgno nPageCount;
  int rc;
  PgHdr *pPg_local;
  
  pg1 = 0;
  pPager._0_4_ = 0;
  _pg = pPg->pPager;
  pPage._4_4_ = (int)((long)(ulong)_pg->sectorSize / _pg->pageSize);
  _pg->doNotSpill = _pg->doNotSpill | 4;
  ii = (pPg->pgno - 1 & (pPage._4_4_ - 1U ^ 0xffffffff)) + 1;
  nPage = _pg->dbSize;
  if ((uint)nPage < pPg->pgno) {
    needSync = (pPg->pgno - ii) + 1;
  }
  else {
    needSync = pPage._4_4_;
    if ((uint)nPage < (ii + pPage._4_4_) - 1U) {
      needSync = (nPage + 1U) - ii;
    }
  }
  _nPageCount = pPg;
  for (pPager._4_4_ = 0; pPager._4_4_ < needSync && pg1 == 0; pPager._4_4_ = pPager._4_4_ + 1) {
    pPage._0_4_ = ii + pPager._4_4_;
    if (((u32)pPage == _nPageCount->pgno) ||
       (iVar1 = sqlite3BitvecTest(_pg->pInJournal,(u32)pPage), iVar1 == 0)) {
      if (((u32)pPage != _pg->lckPgno) &&
         (pg1 = sqlite3PagerGet(_pg,(u32)pPage,&pPage_1,0), pg1 == 0)) {
        pg1 = pager_write(pPage_1);
        if ((pPage_1->flags & 8) != 0) {
          pPager._0_4_ = 1;
        }
        sqlite3PagerUnrefNotNull(pPage_1);
      }
    }
    else {
      pPage_1 = sqlite3PagerLookup(_pg,(u32)pPage);
      if (pPage_1 != (DbPage *)0x0) {
        if ((pPage_1->flags & 8) != 0) {
          pPager._0_4_ = 1;
        }
        sqlite3PagerUnrefNotNull(pPage_1);
      }
    }
  }
  if ((pg1 == 0) && ((int)pPager != 0)) {
    for (pPager._4_4_ = 0; pPager._4_4_ < needSync; pPager._4_4_ = pPager._4_4_ + 1) {
      pPg_00 = sqlite3PagerLookup(_pg,ii + pPager._4_4_);
      if (pPg_00 != (DbPage *)0x0) {
        pPg_00->flags = pPg_00->flags | 8;
        sqlite3PagerUnrefNotNull(pPg_00);
      }
    }
  }
  _pg->doNotSpill = _pg->doNotSpill & 0xfb;
  return pg1;
}

Assistant:

static SQLITE_NOINLINE int pagerWriteLargeSector(PgHdr *pPg){
  int rc = SQLITE_OK;          /* Return code */
  Pgno nPageCount;             /* Total number of pages in database file */
  Pgno pg1;                    /* First page of the sector pPg is located on. */
  int nPage = 0;               /* Number of pages starting at pg1 to journal */
  int ii;                      /* Loop counter */
  int needSync = 0;            /* True if any page has PGHDR_NEED_SYNC */
  Pager *pPager = pPg->pPager; /* The pager that owns pPg */
  Pgno nPagePerSector = (pPager->sectorSize/pPager->pageSize);

  /* Set the doNotSpill NOSYNC bit to 1. This is because we cannot allow
  ** a journal header to be written between the pages journaled by
  ** this function.
  */
  assert( !MEMDB );
  assert( (pPager->doNotSpill & SPILLFLAG_NOSYNC)==0 );
  pPager->doNotSpill |= SPILLFLAG_NOSYNC;

  /* This trick assumes that both the page-size and sector-size are
  ** an integer power of 2. It sets variable pg1 to the identifier
  ** of the first page of the sector pPg is located on.
  */
  pg1 = ((pPg->pgno-1) & ~(nPagePerSector-1)) + 1;

  nPageCount = pPager->dbSize;
  if( pPg->pgno>nPageCount ){
    nPage = (pPg->pgno - pg1)+1;
  }else if( (pg1+nPagePerSector-1)>nPageCount ){
    nPage = nPageCount+1-pg1;
  }else{
    nPage = nPagePerSector;
  }
  assert(nPage>0);
  assert(pg1<=pPg->pgno);
  assert((pg1+nPage)>pPg->pgno);

  for(ii=0; ii<nPage && rc==SQLITE_OK; ii++){
    Pgno pg = pg1+ii;
    PgHdr *pPage;
    if( pg==pPg->pgno || !sqlite3BitvecTest(pPager->pInJournal, pg) ){
      if( pg!=PAGER_SJ_PGNO(pPager) ){
        rc = sqlite3PagerGet(pPager, pg, &pPage, 0);
        if( rc==SQLITE_OK ){
          rc = pager_write(pPage);
          if( pPage->flags&PGHDR_NEED_SYNC ){
            needSync = 1;
          }
          sqlite3PagerUnrefNotNull(pPage);
        }
      }
    }else if( (pPage = sqlite3PagerLookup(pPager, pg))!=0 ){
      if( pPage->flags&PGHDR_NEED_SYNC ){
        needSync = 1;
      }
      sqlite3PagerUnrefNotNull(pPage);
    }
  }

  /* If the PGHDR_NEED_SYNC flag is set for any of the nPage pages
  ** starting at pg1, then it needs to be set for all of them. Because
  ** writing to any of these nPage pages may damage the others, the
  ** journal file must contain sync()ed copies of all of them
  ** before any of them can be written out to the database file.
  */
  if( rc==SQLITE_OK && needSync ){
    assert( !MEMDB );
    for(ii=0; ii<nPage; ii++){
      PgHdr *pPage = sqlite3PagerLookup(pPager, pg1+ii);
      if( pPage ){
        pPage->flags |= PGHDR_NEED_SYNC;
        sqlite3PagerUnrefNotNull(pPage);
      }
    }
  }

  assert( (pPager->doNotSpill & SPILLFLAG_NOSYNC)!=0 );
  pPager->doNotSpill &= ~SPILLFLAG_NOSYNC;
  return rc;
}